

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void __thiscall Mesh::exportMESH(Mesh *this,string *filePath)

{
  Tetrahedron *this_00;
  bool bVar1;
  size_type sVar2;
  ostream *poVar3;
  reference ppNVar4;
  double *pdVar5;
  reference ppTVar6;
  reference ppNVar7;
  Tetrahedron *e;
  iterator __end1_1;
  iterator __begin1_1;
  vector<Tetrahedron_*,_std::allocator<Tetrahedron_*>_> *__range1_1;
  int local_250 [2];
  Node *local_248;
  Node *n;
  iterator __end1;
  iterator __begin1;
  vector<Node_*,_std::allocator<Node_*>_> *__range1;
  ostream local_218 [8];
  ofstream file;
  string *filePath_local;
  Mesh *this_local;
  
  std::ofstream::ofstream(local_218,(string *)filePath,_S_out);
  std::operator<<(local_218,"MeshVersionFormatted 2\n");
  std::operator<<(local_218,"Dimension\n         3\n");
  std::operator<<(local_218,"Vertices\n");
  sVar2 = std::vector<Node_*,_std::allocator<Node_*>_>::size(&this->nodes);
  poVar3 = (ostream *)std::ostream::operator<<(local_218,sVar2);
  std::operator<<(poVar3,"\n");
  __end1 = std::vector<Node_*,_std::allocator<Node_*>_>::begin(&this->nodes);
  n = (Node *)std::vector<Node_*,_std::allocator<Node_*>_>::end(&this->nodes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                                *)&n);
    if (!bVar1) break;
    ppNVar4 = __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
              operator*(&__end1);
    local_248 = *ppNVar4;
    local_250[1] = 0;
    pdVar5 = Vector3D::operator[](&local_248->pos,local_250 + 1);
    poVar3 = (ostream *)std::ostream::operator<<(local_218,*pdVar5);
    poVar3 = std::operator<<(poVar3,"  ");
    local_250[0] = 1;
    pdVar5 = Vector3D::operator[](&local_248->pos,local_250);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pdVar5);
    poVar3 = std::operator<<(poVar3,"  ");
    __range1_1._4_4_ = 2;
    pdVar5 = Vector3D::operator[](&local_248->pos,(int *)((long)&__range1_1 + 4));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pdVar5);
    poVar3 = std::operator<<(poVar3,"  ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_248->label);
    std::operator<<(poVar3,"\n");
    __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::operator++
              (&__end1);
  }
  std::operator<<(local_218,"Tetrahedra\n");
  sVar2 = std::vector<Tetrahedron_*,_std::allocator<Tetrahedron_*>_>::size(&this->tetrahedrons);
  poVar3 = (ostream *)std::ostream::operator<<(local_218,sVar2);
  std::operator<<(poVar3,"\n");
  __end1_1 = std::vector<Tetrahedron_*,_std::allocator<Tetrahedron_*>_>::begin(&this->tetrahedrons);
  e = (Tetrahedron *)
      std::vector<Tetrahedron_*,_std::allocator<Tetrahedron_*>_>::end(&this->tetrahedrons);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<Tetrahedron_**,_std::vector<Tetrahedron_*,_std::allocator<Tetrahedron_*>_>_>
                        *)&e);
    if (!bVar1) break;
    ppTVar6 = __gnu_cxx::
              __normal_iterator<Tetrahedron_**,_std::vector<Tetrahedron_*,_std::allocator<Tetrahedron_*>_>_>
              ::operator*(&__end1_1);
    this_00 = *ppTVar6;
    ppNVar7 = std::array<Node_*,_4UL>::operator[](&this_00->nodes,0);
    poVar3 = (ostream *)std::ostream::operator<<(local_218,(*ppNVar7)->index + 1);
    poVar3 = std::operator<<(poVar3,"  ");
    ppNVar7 = std::array<Node_*,_4UL>::operator[](&this_00->nodes,1);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(*ppNVar7)->index + 1);
    poVar3 = std::operator<<(poVar3,"  ");
    ppNVar7 = std::array<Node_*,_4UL>::operator[](&this_00->nodes,2);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(*ppNVar7)->index + 1);
    poVar3 = std::operator<<(poVar3,"  ");
    ppNVar7 = std::array<Node_*,_4UL>::operator[](&this_00->nodes,3);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(*ppNVar7)->index + 1);
    poVar3 = std::operator<<(poVar3,"  ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this_00->label);
    std::operator<<(poVar3,"\n");
    __gnu_cxx::
    __normal_iterator<Tetrahedron_**,_std::vector<Tetrahedron_*,_std::allocator<Tetrahedron_*>_>_>::
    operator++(&__end1_1);
  }
  std::operator<<(local_218,"End\n");
  std::ofstream::close();
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void Mesh::exportMESH(const std::string &filePath){
    std::ofstream file(filePath);
    file << "MeshVersionFormatted 2\n";
    file << "Dimension\n         3\n";

    file << "Vertices\n";
    file << nodes.size() << "\n";
    for(auto n:nodes){
        file << n->pos[0] 
        << "  " << n->pos[1] 
        << "  " << n->pos[2]
        << "  " << n->label <<"\n";
    }

    file << "Tetrahedra\n";
    file << tetrahedrons.size() << "\n";
    for(auto e: tetrahedrons){
        file << e->nodes[0]->index + 1
        << "  " << e->nodes[1]->index + 1
        << "  " << e->nodes[2]->index + 1
        << "  " << e->nodes[3]->index + 1
        << "  " << e->label << "\n"; 
    }

    file << "End\n";
    file.close();
}